

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es5503.c
# Opt level: O2

UINT8 device_start_es5503(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  UINT32 UVar2;
  DEV_DATA info;
  void *pvVar3;
  byte bVar4;
  uint uVar5;
  UINT8 UVar6;
  
  info.chipInf = calloc(1,0x358);
  if ((DEV_DATA *)info.chipInf == (DEV_DATA *)0x0) {
    UVar6 = 0xff;
  }
  else {
    *(undefined4 *)&((DEV_DATA *)((long)info.chipInf + 8))->chipInf = 0x20000;
    pvVar3 = malloc(0x20000);
    ((DEV_DATA *)((long)info.chipInf + 0x10))->chipInf = pvVar3;
    uVar1 = cfg->clock;
    *(uint *)((long)info.chipInf + 0x33c) = uVar1;
    bVar4 = cfg->flags + (cfg->flags == '\0');
    *(byte *)&((DEV_DATA *)((long)info.chipInf + 0x340))->chipInf = bVar4;
    uVar5 = bVar4 - 1;
    uVar5 = uVar5 >> 1 | uVar5;
    uVar5 = uVar5 >> 2 | uVar5;
    *(byte *)((long)info.chipInf + 0x341) = (byte)(uVar5 >> 4) | (byte)uVar5;
    *(undefined1 *)&((DEV_DATA *)((long)info.chipInf + 0x338))->chipInf = 1;
    UVar6 = '\0';
    *(uint *)((long)info.chipInf + 0x344) = uVar1 / 0x18;
    es5503_set_mute_mask(info.chipInf,0);
    *(void **)info.chipInf = info.chipInf;
    UVar2 = *(UINT32 *)((long)info.chipInf + 0x344);
    retDevInf->dataPtr = (DEV_DATA *)info.chipInf;
    retDevInf->sampleRate = UVar2;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar6;
}

Assistant:

static UINT8 device_start_es5503(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	ES5503Chip *chip;

	chip = (ES5503Chip *)calloc(1, sizeof(ES5503Chip));
	if (chip == NULL)
		return 0xFF;
	
	chip->irq_func = NULL;
	chip->irq_param = NULL;
	chip->adc_func = NULL;
	chip->adc_param = NULL;
	
	chip->dramsize = 0x20000;	// 128 KB
	chip->docram = (UINT8*)malloc(chip->dramsize);
	chip->clock = cfg->clock;

	chip->output_channels = cfg->flags;
	if (! chip->output_channels)
		chip->output_channels = 1;
	chip->outchn_mask = (UINT8)pow2_mask(chip->output_channels);

	chip->oscsenabled = 1;
	chip->output_rate = es5503_get_sample_rate(chip);
	
	es5503_set_mute_mask(chip, 0x00000000);
	
	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, chip->output_rate, &devDef);
	
	return 0x00;
}